

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale_data.cpp
# Opt level: O2

void __thiscall
booster::locale::util::locale_data::parse_from_country(locale_data *this,string *locale_name)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  string sStack_68;
  string tmp;
  
  uVar3 = 0;
  uVar2 = std::__cxx11::string::find_first_of((char *)locale_name,0x1b1f37);
  std::__cxx11::string::substr((ulong)&tmp,(ulong)locale_name);
  if (tmp._M_string_length != 0) {
    for (; uVar4 = (ulong)uVar3, uVar4 < tmp._M_string_length; uVar3 = uVar3 + 1) {
      if ((byte)(tmp._M_dataplus._M_p[uVar4] + 0x9fU) < 0x1a) {
        tmp._M_dataplus._M_p[uVar4] = tmp._M_dataplus._M_p[uVar4] + -0x20;
      }
    }
    std::__cxx11::string::_M_assign((string *)&this->country);
    if (uVar2 < locale_name->_M_string_length) {
      cVar1 = (locale_name->_M_dataplus)._M_p[uVar2];
      if (cVar1 == '@') {
        std::__cxx11::string::substr((ulong)&sStack_68,(ulong)locale_name);
        parse_from_variant(this,&sStack_68);
      }
      else {
        if (cVar1 != '.') goto LAB_0018cd5b;
        std::__cxx11::string::substr((ulong)&sStack_68,(ulong)locale_name);
        parse_from_encoding(this,&sStack_68);
      }
      std::__cxx11::string::~string((string *)&sStack_68);
    }
  }
LAB_0018cd5b:
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void locale_data::parse_from_country(std::string const &locale_name) 
    {
        size_t end = locale_name.find_first_of("@.");
        std::string tmp = locale_name.substr(0,end);
        if(tmp.empty())
            return;
        for(unsigned i=0;i<tmp.size();i++) {
            if('a' <= tmp[i] && tmp[i]<='z')
                tmp[i]=tmp[i]-'a'+'A';
            else if(tmp[i] < 'A' && 'Z' < tmp[i])
                return;
        }

        country = tmp;

        if(end >= locale_name.size())
            return;
        else if(locale_name[end] == '.') {
           parse_from_encoding(locale_name.substr(end+1));
        }
        else if(locale_name[end] == '@') {
           parse_from_variant(locale_name.substr(end+1));
        }
    }